

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

void __thiscall
MipsOpcodeFormatter::handleOpcodeName(MipsOpcodeFormatter *this,MipsOpcodeData *opData)

{
  char *pcVar1;
  char *local_20;
  char *encoding;
  MipsOpcodeData *opData_local;
  MipsOpcodeFormatter *this_local;
  
  pcVar1 = (opData->opcode).name;
  while (local_20 = pcVar1, *local_20 != '\0') {
    pcVar1 = local_20 + 1;
    if (*local_20 != 'B') {
      if (*local_20 == 'S') {
        std::__cxx11::string::operator+=((string *)this,"sptq"[opData->vfpuSize]);
      }
      else {
        std::__cxx11::string::operator+=((string *)this,*local_20);
      }
    }
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeName(const MipsOpcodeData& opData)
{
	const char* encoding = opData.opcode.name;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			buffer += "sptq"[opData.vfpuSize];
			break;
		case 'B':
			// TODO
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}